

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_scanner.c
# Opt level: O2

void yyrestart(FILE *input_file)

{
  YY_BUFFER_STATE b;
  
  if ((yy_buffer_stack == (YY_BUFFER_STATE *)0x0) ||
     (b = yy_buffer_stack[yy_buffer_stack_top], b == (YY_BUFFER_STATE)0x0)) {
    yyensure_buffer_stack();
    b = yy_create_buffer(yyin,0x4000);
    yy_buffer_stack[yy_buffer_stack_top] = b;
  }
  yy_init_buffer(b,input_file);
  yy_load_buffer_state();
  return;
}

Assistant:

void yyrestart  (FILE * input_file )
{
    
	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack ();
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE );
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file );
	yy_load_buffer_state(  );
}